

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

int run_bitset_container_intersection_cardinality(run_container_t *src_1,bitset_container_t *src_2)

{
  _Bool _Var1;
  int iVar2;
  bitset_container_t *in_RSI;
  run_container_t *in_RDI;
  rle16_t rle;
  int32_t rlepos;
  int answer;
  uint32_t lenminusone;
  uint32_t local_4;
  
  _Var1 = run_container_is_full(in_RDI);
  if (_Var1) {
    local_4 = bitset_container_cardinality(in_RSI);
  }
  else {
    local_4 = 0;
    for (lenminusone = 0; (int)lenminusone < in_RDI->n_runs; lenminusone = lenminusone + 1) {
      iVar2 = bitset_lenrange_cardinality((uint64_t *)in_RSI,local_4,lenminusone);
      local_4 = iVar2 + local_4;
    }
  }
  return local_4;
}

Assistant:

int run_bitset_container_intersection_cardinality(
    const run_container_t *src_1, const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return bitset_container_cardinality(src_2);
    }
    int answer = 0;
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        answer +=
            bitset_lenrange_cardinality(src_2->words, rle.value, rle.length);
    }
    return answer;
}